

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.c
# Opt level: O3

_Bool render_tour_image(char *filepath,Instance *instance,Tour *tour,char *filext)

{
  undefined8 uVar1;
  int iVar2;
  Vec2d *pVVar3;
  uint uVar4;
  char *pcVar5;
  FILE *__s;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar22;
  char command [8192];
  char local_2038 [8191];
  undefined1 local_39;
  undefined1 auVar21 [16];
  
  pcVar5 = guess_plot_filext(filepath,filext);
  uVar4 = instance->num_customers;
  uVar10 = (ulong)uVar4;
  dVar13 = 9999999999.0;
  if ((int)uVar4 < 0) {
    dVar16 = -109999998.0;
    dVar18 = -19999998.0;
    dVar19 = 99999999.0;
    dVar22 = 9999999.0;
  }
  else {
    lVar7 = 0;
    auVar17 = _DAT_00109580;
    auVar21 = _DAT_00109570;
    do {
      uVar1 = *(undefined8 *)((long)&instance->positions->x + lVar7);
      auVar20._8_8_ = uVar1;
      auVar20._0_8_ = uVar1;
      auVar17 = maxpd(auVar17,auVar20);
      auVar21 = minpd(auVar20,auVar21);
      dVar19 = auVar21._0_8_;
      lVar7 = lVar7 + 0x10;
    } while (uVar10 * 0x10 + 0x10 != lVar7);
    dVar16 = auVar17._0_8_ - dVar19;
    dVar22 = auVar21._8_8_;
    dVar18 = auVar17._8_8_ - dVar22;
    if (-1 < (int)uVar4) {
      dVar13 = 9999999999.0;
      lVar7 = 0;
      lVar8 = 0;
      do {
        lVar9 = 0;
        do {
          if (lVar7 != lVar9) {
            pVVar3 = instance->positions;
            dVar14 = *(double *)((long)&pVVar3->x + lVar9) - pVVar3[lVar8].x;
            dVar15 = *(double *)((long)&pVVar3->y + lVar9) - pVVar3[lVar8].y;
            dVar14 = SQRT(dVar14 * dVar14 + dVar15 * dVar15);
            if (dVar14 <= dVar13) {
              dVar13 = dVar14;
            }
          }
          lVar9 = lVar9 + 0x10;
        } while ((uVar10 + 1) * 0x10 != lVar9);
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 0x10;
      } while (lVar8 != uVar10 + 1);
    }
  }
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  memset(local_2038,0,0x2000);
  snprintf(local_2038,0x2000,"neato \'-T%s\' -o \'%s\' 1> /dev/null 2>/dev/null",pcVar5,filepath);
  local_39 = 0;
  log_log(0x20,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/render.c"
          ,0x6f,"%s :: Running popen(%s)\n","render_tour_image",local_2038);
  __s = popen(local_2038,"w");
  if (__s == (FILE *)0x0) {
    return false;
  }
  fwrite("strict digraph {\n",0x11,1,__s);
  fwrite("    labelloc=\"t\"\n",0x11,1,__s);
  fwrite("    graph [pad=\"0.212, 0.055\", bgcolor=white, fontname = \"monospace\"]\n",0x46,1,__s);
  fwrite("    node [style=filled]\n",0x18,1,__s);
  if ((int)uVar4 < 0) {
    if (tour->num_comps != 1) goto LAB_00106010;
  }
  else {
    dVar14 = dVar18;
    if (dVar16 <= dVar18) {
      dVar14 = dVar16;
    }
    lVar7 = 8;
    uVar12 = 0;
    do {
      fprintf(__s,
              "    %d [fillcolor=\"#dddddd\" pos=\"%f,%f!\" pin=\"true\" shape=\"circle\" label=\"%d\"]\n"
              ,((*(double *)((long)instance->positions + lVar7 + -8) - dVar22) / dVar18) /
               (dVar13 / dVar14),
              ((*(double *)((long)&instance->positions->x + lVar7) - dVar19) / dVar16) /
              (dVar13 / dVar14),uVar12 & 0xffffffff,uVar12 & 0xffffffff);
      uVar12 = uVar12 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar10 + 1 != uVar12);
    if (tour->num_comps != 1) {
LAB_00106010:
      __assert_fail("tour->num_comps == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/render.c"
                    ,0x8b,
                    "_Bool render_tour_image(const char *, const Instance *, Tour *, const char *)")
      ;
    }
    if (-1 < (int)uVar4) {
      iVar11 = 0;
      while( true ) {
        iVar2 = tour->num_customers;
        iVar6 = -1;
        if (-1 < iVar2) {
          iVar6 = iVar2;
        }
        uVar12 = 0;
        while( true ) {
          if (iVar6 + 1 == uVar12) goto LAB_00105fcc;
          if (tour->comp[uVar12] == iVar11) break;
          uVar12 = uVar12 + 1;
          if (uVar10 + 1 == uVar12) goto LAB_00105ff1;
        }
        if (uVar12 != 0) break;
        if (iVar2 < 0) {
LAB_00105fcc:
          __assert_fail("idx >= 0 && idx < len",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/types.h"
                        ,0x6c,"int32_t *veci32_access(int32_t *, int32_t, int32_t)");
        }
        uVar12 = 0;
        while (uVar4 = tour->succ[uVar12], uVar4 != 0) {
          fprintf(__s,"   %d -> %d [fontsize=\"8\"]\n",uVar12,(ulong)uVar4);
          if (((int)uVar4 < 0) || (uVar12 = (ulong)uVar4, tour->num_customers < (int)uVar4))
          goto LAB_00105fcc;
        }
        fprintf(__s,"   %d -> %d [fontsize=\"8\"]\n",uVar12,0);
        iVar11 = iVar11 + 1;
        if (tour->num_comps <= iVar11) {
          fwrite("}\n",2,1,__s);
          uVar4 = pclose(__s);
          log_log(0x20,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/render.c"
                  ,0xb0,"%s :: graphviz dump creation process terminated with exit code %d",
                  "render_tour_image",(ulong)uVar4);
          return uVar4 == 0;
        }
      }
    }
  }
LAB_00105ff1:
  __assert_fail("first_node_in_comp == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/render.c"
                ,0x96,
                "_Bool render_tour_image(const char *, const Instance *, Tour *, const char *)");
}

Assistant:

bool render_tour_image(const char *filepath, const Instance *instance,
                       Tour *tour, const char *filext) {

    // Try to autodetect the filepath
    filext = guess_plot_filext(filepath, filext);

    int32_t n = instance->num_customers + 1;
    bool result = true;

    double min_dist = 9999999999;
    double smaller_coord = 9999999999;
    double llx, lly, w, h;

    compute_plotting_region(instance, &llx, &lly, &w, &h);

    for (int32_t i = 0; i < n; i++) {
        for (int32_t j = 0; j < n; j++) {
            if (i != j) {
                const Vec2d *ipos = &instance->positions[i];
                const Vec2d *jpos = &instance->positions[j];

                smaller_coord = MIN(smaller_coord, ipos->x);
                smaller_coord = MIN(smaller_coord, ipos->y);
                smaller_coord = MIN(smaller_coord, jpos->x);
                smaller_coord = MIN(smaller_coord, jpos->y);

                double d = vec2d_dist(ipos, jpos);
                min_dist = MIN(min_dist, d);
            }
        }
    }

    min_dist = sqrt(min_dist) / MIN(w, h);

    // min_dist = exp(min_dist);

    char command[8192] = "";

    snprintf(command, ARRAY_LEN(command),
             "neato '-T%s' -o '%s' 1> /dev/null 2>/dev/null", filext, filepath);
    command[ARRAY_LEN(command) - 1] = '\0';

    log_info("%s :: Running popen(%s)\n", __func__, command);

    FILE *gp = popen(command, "w");
    if (!gp) {
        result = false;
        goto terminate;
    }

    fprintf(gp, "strict digraph {\n");
    fprintf(gp, "    labelloc=\"t\"\n");
    fprintf(gp, "    graph [pad=\"0.212, 0.055\", bgcolor=white, fontname = "
                "\"monospace\"]\n");
    fprintf(gp, "    node [style=filled]\n");

    //
    // Declare the nodes and style them. Apply some size normalization for the
    // output render target.
    //
    for (int32_t i = 0; i < n; i++) {
        const Vec2d *pos = &instance->positions[i];

        fprintf(gp,
                "    %d [fillcolor=\"#dddddd\" pos=\"%f,%f!\" pin=\"true\" "
                "shape=\"circle\" label=\"%d\"]\n",
                i, ((pos->x - llx) / w / min_dist),
                ((pos->y - lly) / h / min_dist), i);
    }

    assert(tour->num_comps == 1);

    for (int32_t comp = 0; comp < tour->num_comps; comp++) {
        int32_t first_node_in_comp = -1;
        for (int32_t i = 0; i < n; i++) {
            if (*tcomp(tour, i) == comp) {
                first_node_in_comp = i;
                break;
            }
        }

        assert(first_node_in_comp == 0);

        if (first_node_in_comp != -1) {

            int32_t curr_vertex = first_node_in_comp;
            int32_t next_vertex = curr_vertex;

            while ((next_vertex = *tsucc(tour, curr_vertex)) !=
                   first_node_in_comp) {
                fprintf(gp, "   %d -> %d [fontsize=\"8\"]\n", curr_vertex,
                        next_vertex);
                curr_vertex = next_vertex;
            }
            assert(next_vertex == first_node_in_comp);
            fprintf(gp, "   %d -> %d [fontsize=\"8\"]\n", curr_vertex,
                    first_node_in_comp);
        }
    }

    fprintf(gp, "}\n");

terminate:
    if (gp) {
        int exit_code = pclose(gp);
        log_info("%s :: graphviz dump creation process terminated with "
                 "exit code %d",
                 __func__, exit_code);
        result = exit_code == 0;
    }

    return result;
}